

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

i64 sqlite3VdbeIntValue(Mem *pMem)

{
  double dVar1;
  ushort uVar2;
  i64 iVar3;
  double dVar4;
  
  uVar2 = pMem->flags;
  if ((uVar2 & 0x24) == 0) {
    if ((uVar2 & 8) == 0) {
      if (((uVar2 & 0x12) != 0) && (pMem->z != (char *)0x0)) {
        iVar3 = memIntValue(pMem);
        return iVar3;
      }
      return 0;
    }
    dVar4 = NAN;
    dVar1 = (pMem->u).r;
    if (dVar1 < -9.223372036854775e+18) {
      return -0x8000000000000000;
    }
    if (dVar1 <= 9.223372036854775e+18) {
      return (long)dVar1;
    }
  }
  else {
    dVar4 = (pMem->u).r;
  }
  return (i64)dVar4;
}

Assistant:

SQLITE_PRIVATE i64 sqlite3VdbeIntValue(const Mem *pMem){
  int flags;
  assert( pMem!=0 );
  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( EIGHT_BYTE_ALIGNMENT(pMem) );
  flags = pMem->flags;
  if( flags & (MEM_Int|MEM_IntReal) ){
    testcase( flags & MEM_IntReal );
    return pMem->u.i;
  }else if( flags & MEM_Real ){
    return sqlite3RealToI64(pMem->u.r);
  }else if( (flags & (MEM_Str|MEM_Blob))!=0 && pMem->z!=0 ){
    return memIntValue(pMem);
  }else{
    return 0;
  }
}